

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

pattern * featureItem(void)

{
  pattern *ppVar1;
  char *s;
  int signFactor;
  char msg [100];
  char acStack_78 [112];
  
  switch(lookahead) {
  case 400:
    matchTok(400);
    ppVar1 = featureItem();
    ppVar1 = makeNode(ppVar1,(pattern *)0x0,0x12e);
    return ppVar1;
  case 0x191:
    signFactor = 1;
LAB_001241f4:
    ppVar1 = numericItem(signFactor);
    return ppVar1;
  case 0x192:
    goto switchD_00124165_caseD_192;
  case 0x193:
    ppVar1 = idItem();
    return ppVar1;
  case 0x194:
    ppVar1 = distItem();
    return ppVar1;
  default:
    if (lookahead == 0x2d) {
      matchTok(0x2d);
      if (lookahead == 0x191) {
        signFactor = -1;
        goto LAB_001241f4;
      }
      s = "syntax: minus sign requires a number ";
      goto LAB_00124205;
    }
    if (lookahead == 0x28) {
      matchTok(0x28);
      ppVar1 = exprItem();
      matchTok(0x29);
      return ppVar1;
    }
switchD_00124165_caseD_192:
    s = "syntax: improper feature ";
LAB_00124205:
    describeLookahead(acStack_78,s);
    errmsg(acStack_78);
    ParseError = 1;
    return (pattern *)0x0;
  }
}

Assistant:

pattern* featureItem() {
   pattern *f = NULL;

   if (lookahead == '(') {
      matchTok('(');
      f = exprItem();
      matchTok(')');
   }
   else if (lookahead == NOT_TOK) {
      matchTok(NOT_TOK);
      f = featureItem();
      f = makeNode(f, NULL, NOT_NODE);
   }
   else if (lookahead == NUM_TOK) {
      f = numericItem(+1);
   }
   else if (lookahead == ID_TOK) {
      f = idItem();
   }
   else if (lookahead == WITHIN_TOK) {
      f = distItem();
   }
   /* if an item starts with a minus  */
   /* it is a negative residue number */
   else if (lookahead == '-') {
      matchTok('-');
      if (lookahead == NUM_TOK) {
         f = numericItem(-1);
      }
      else {
         char msg[100];
         describeLookahead(msg,"syntax: minus sign requires a number ");
         errmsg(msg);
         ParseError = TRUE;
      }
   }
   else {
     char msg[100];
     describeLookahead(msg,"syntax: improper feature ");
     errmsg(msg);
     ParseError = TRUE;
   }
   return f;
}